

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceDataEntry *
findFirstExisting(char *path,char *name,UBool *isRoot,UBool *hasChopped,UBool *isDefault,
                 UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *__s2;
  UResourceDataEntry *pUVar3;
  size_t __n;
  bool bVar4;
  
  UVar1 = '\x01';
  pUVar3 = (UResourceDataEntry *)0x0;
  __s2 = uloc_getDefault_63();
  bVar4 = false;
  while( true ) {
    *hasChopped = UVar1;
    if (UVar1 == '\0') {
      return pUVar3;
    }
    if (bVar4) break;
    pUVar3 = init_entry(name,path,status);
    if (U_ZERO_ERROR < *status) {
      return (UResourceDataEntry *)0x0;
    }
    __n = strlen(name);
    iVar2 = strncmp(name,__s2,__n);
    *isDefault = iVar2 == 0;
    bVar4 = pUVar3->fBogus == U_ZERO_ERROR;
    if (bVar4) {
      strcpy(name,pUVar3->fName);
    }
    else {
      pUVar3->fCountExisting = pUVar3->fCountExisting - 1;
      *status = U_ERROR_WARNING_START;
      pUVar3 = (UResourceDataEntry *)0x0;
    }
    iVar2 = strcmp(name,"root");
    *isRoot = iVar2 == 0;
    UVar1 = chopLocale(name);
  }
  return pUVar3;
}

Assistant:

static UResourceDataEntry *
findFirstExisting(const char* path, char* name,
                  UBool *isRoot, UBool *hasChopped, UBool *isDefault, UErrorCode* status) {
    UResourceDataEntry *r = NULL;
    UBool hasRealData = FALSE;
    const char *defaultLoc = uloc_getDefault();
    *hasChopped = TRUE; /* we're starting with a fresh name */

    while(*hasChopped && !hasRealData) {
        r = init_entry(name, path, status);
        /* Null pointer test */
        if (U_FAILURE(*status)) {
            return NULL;
        }
        *isDefault = (UBool)(uprv_strncmp(name, defaultLoc, uprv_strlen(name)) == 0);
        hasRealData = (UBool)(r->fBogus == U_ZERO_ERROR);
        if(!hasRealData) {
            /* this entry is not real. We will discard it. */
            /* However, the parent line for this entry is  */
            /* not to be used - as there might be parent   */
            /* lines in cache from previous openings that  */
            /* are not updated yet. */
            r->fCountExisting--;
            /*entryCloseInt(r);*/
            r = NULL;
            *status = U_USING_FALLBACK_WARNING;
        } else {
            uprv_strcpy(name, r->fName); /* this is needed for supporting aliases */
        }

        *isRoot = (UBool)(uprv_strcmp(name, kRootLocaleName) == 0);

        /*Fallback data stuff*/
        *hasChopped = chopLocale(name);
    }
    return r;
}